

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_long,_unsigned_long,_3>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *lhs,unsigned_long *rhs,unsigned_long *result)

{
  ulong *in_RDX;
  long *in_RSI;
  ulong *in_RDI;
  uint64_t tmp;
  
  if (*in_RDI <= *in_RDI + *in_RSI) {
    *in_RDX = *in_RDI + *in_RSI;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs std::uint64_t, rhs unsigned
        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        // We added and it didn't get smaller
        if(tmp >= lhs)
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }